

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2Runner.hpp
# Opt level: O3

int __thiscall Centaurus::Stage2Runner::parse_subtree(Stage2Runner *this,uint64_t *ast,int position)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  atomic<int> *paVar3;
  int iVar4;
  int position_00;
  uint64_t uVar5;
  SimpleException *this_00;
  int iVar6;
  ulong uVar7;
  uint64_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  SymbolEntry sym;
  string local_50;
  
  uVar11 = (this->super_BaseRunner).m_bank_size;
  iVar6 = position + 1;
  uVar10 = (ulong)iVar6;
  position_00 = iVar6;
  if (uVar10 < uVar11 >> 3) {
    uVar1 = ast[position];
    uVar7 = uVar10;
    iVar4 = iVar6;
    do {
      uVar9 = ast[uVar7];
      if (uVar9 == 0) {
        this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Null entry in CST window.","");
        SimpleException::SimpleException(this_00,&local_50);
        __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
      }
      if ((uVar9 & 0x7fff000000000000) == 0 || -1 < (long)uVar9) {
        if (0xffffffffffff < (long)uVar9) {
          puVar2 = (this->val_stack).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar2) {
            (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar2;
          }
          if (iVar6 < iVar4) {
            puVar8 = ast + (long)position + 2;
            uVar11 = uVar10;
            do {
              __position._M_current =
                   (this->val_stack).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->val_stack).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->val_stack,
                           __position,puVar8);
              }
              else {
                *__position._M_current = *puVar8;
                (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              uVar11 = uVar11 + 2;
              puVar8 = puVar8 + 2;
            } while ((long)uVar11 < (long)iVar4);
          }
          local_50._M_dataplus._M_p = (pointer)(uVar9 >> 0x30);
          uVar9 = uVar9 & 0xffffffffffff;
          local_50._M_string_length = uVar1 & 0xffffffffffff;
          local_50.field_2._M_allocated_capacity = uVar9;
          if (this->m_listener == (ReductionListener)0x0) {
            uVar5 = 0;
          }
          else {
            puVar8 = (this->val_stack).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = (*this->m_listener)((SymbolEntry *)&local_50,puVar8,
                                        (int)((ulong)((long)(this->val_stack).
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar8) >> 3),this->m_listener_context);
          }
          paVar3 = this->reduction_counter;
          if (paVar3 != (atomic<int> *)0x0) {
            LOCK();
            *(int *)paVar3 = *(int *)paVar3 + 1;
            UNLOCK();
          }
          if (iVar6 < iVar4) {
            memset(ast + (long)position + 1,0,(ulong)((iVar4 - position) - 2) * 8 + 8);
          }
          ast[uVar7] = 0;
          ast[position] = uVar9 | 0x8000000000000000;
          ast[uVar10] = uVar5;
          return position_00;
        }
      }
      else {
        position_00 = parse_subtree(this,ast,position_00);
        uVar11 = (this->super_BaseRunner).m_bank_size;
        if ((ulong)(long)position_00 < uVar11 >> 3) {
          uVar5 = ast[uVar7];
          ast[uVar7] = 0;
          ast[iVar4] = uVar5;
          uVar5 = ast[uVar7 + 1];
          ast[uVar7 + 1] = 0;
          ast[(long)iVar4 + 1] = uVar5;
          uVar11 = (this->super_BaseRunner).m_bank_size;
          iVar4 = iVar4 + 2;
        }
      }
      position_00 = position_00 + 1;
      uVar7 = (ulong)position_00;
    } while (uVar7 < uVar11 >> 3);
  }
  return position_00;
}

Assistant:

int parse_subtree(uint64_t *ast, int position)
  {
    CSTMarker start_marker(ast[position]);
    int i, j;
    j = position + 1;
    for (i = position + 1; i < m_bank_size / 8; i++) {
      if (ast[i] == 0) {
        throw SimpleException("Null entry in CST window.");
      }
      CSTMarker marker(ast[i]);
      if (marker.is_start_marker()) {
        int k = parse_subtree(ast, i);
        if (k < m_bank_size / 8) {
          uint64_t subtree_sv[2];
          subtree_sv[0] = ast[i];
          ast[i] = 0;
          ast[j] = subtree_sv[0];
          subtree_sv[1] = ast[i + 1];
          ast[i + 1] = 0;
          ast[j + 1] = subtree_sv[1];
          j += 2;
        }
        i = k;
      } else if (marker.is_end_marker()) {
        val_stack.clear();
        for (int l = position + 1; l < j; l += 2) {
          val_stack.emplace_back(ast[l + 1]);
        }
        long tag = 0;
        SymbolEntry sym(marker.get_machine_id(), start_marker.get_offset(), marker.get_offset());
        if (m_listener != nullptr)
          tag = m_listener(&sym, val_stack.data(), val_stack.size(), m_listener_context);
        if (reduction_counter != nullptr) {
          (*reduction_counter)++;
        }
        //Zero-fill the SV list
        for (int k = position + 1; k < j; k++) {
          ast[k] = 0;
        }
        //Zero-fill the end marker
        ast[i] = 0;
        ast[position] = ((uint64_t)1 << 63) | marker.get_offset();
        ast[position + 1] = tag;
        return i;
      }
    }
    return i;
  }